

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j1939acd.c
# Opt level: O0

int claim_address(int sock,uint64_t name,int sa)

{
  uint sock_00;
  int iVar1;
  char *pcVar2;
  undefined4 in_EDX;
  int in_EDI;
  sockaddr_can saddr;
  int ret;
  FILE *__stream;
  sockaddr *__addr;
  sa_family_t local_30;
  
  local_30 = 0x1d;
  sock_00 = if_nametoindex(s.intf);
  if (s.verbose != 0) {
    __stream = _stderr;
    pcVar2 = libj1939_addr2str((sockaddr_can *)_stderr);
    fprintf(__stream,"- bind(, %s, %zi);\n",pcVar2,0x18);
  }
  __addr = (sockaddr *)&local_30;
  iVar1 = bind(in_EDI,__addr,0x18);
  if (iVar1 < 0) {
    err(1,"rebind with sa 0x%02x",in_EDX);
  }
  s.last_sa = (uint8_t)in_EDX;
  iVar1 = repeat_address(sock_00,(uint64_t)__addr);
  return iVar1;
}

Assistant:

static int claim_address(int sock, uint64_t name, int sa)
{
	int ret;
	struct sockaddr_can saddr = {
		.can_family = AF_CAN,
		.can_addr.j1939 = {
			.name = name,
			.addr = sa,
			.pgn = J1939_NO_PGN,
		},
		.can_ifindex = if_nametoindex(s.intf),
	};

	if (s.verbose)
		fprintf(stderr, "- bind(, %s, %zi);\n", libj1939_addr2str(&saddr), sizeof(saddr));
	ret = bind(sock, (void *)&saddr, sizeof(saddr));
	if (ret < 0)
		err(1, "rebind with sa 0x%02x", sa);
	s.last_sa = sa;
	return repeat_address(sock, name);
}